

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O2

void __thiscall jbcoin::Logs::threshold(Logs *this,Severity thresh)

{
  _Base_ptr p_Var1;
  
  std::mutex::lock(&this->mutex_);
  this->thresh_ = thresh;
  for (p_Var1 = (this->sinks_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->sinks_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x30))(*(long **)(p_Var1 + 2),thresh);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void
Logs::threshold (beast::severities::Severity thresh)
{
    std::lock_guard <std::mutex> lock (mutex_);
    thresh_ = thresh;
    for (auto& sink : sinks_)
        sink.second->threshold (thresh);
}